

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

int32_t icu_63::parseAsciiDigits(UnicodeString *str,int32_t start,int32_t length,UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char16_t *pcVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (0 < length) {
    uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      uVar7 = (str->fUnion).fFields.fLength;
    }
    else {
      uVar7 = (int)(short)uVar1 >> 5;
    }
    if (length + start <= (int)uVar7 && start <= (int)uVar7) {
      iVar8 = 1;
      if ((uint)start < uVar7) {
        if ((uVar1 & 2) == 0) {
          pcVar5 = (str->fUnion).fFields.fArray;
        }
        else {
          pcVar5 = (char16_t *)((long)&str->fUnion + 2);
        }
        iVar8 = 1;
        if (pcVar5[start] != L'+') {
          if (pcVar5[start] != L'-') goto LAB_0028ef0f;
          iVar8 = -1;
        }
        length = length - 1;
        if (length == 0) {
          iVar4 = 0;
LAB_0028ef8c:
          return iVar8 * iVar4;
        }
        start = start + 1;
      }
LAB_0028ef0f:
      if ((uVar1 & 2) == 0) {
        pcVar5 = (str->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&str->fUnion + 2);
      }
      bVar2 = true;
      iVar4 = 0;
      uVar3 = uVar7 - start;
      if (uVar7 < (uint)start) {
        uVar3 = 0;
      }
      if (uVar7 >= (uint)start && uVar7 - start != 0) {
        iVar4 = 0;
        uVar6 = 1;
        do {
          if (9 < (ushort)(pcVar5[(long)start + (uVar6 - 1)] + L'￐')) break;
          iVar4 = (uint)(ushort)pcVar5[(long)start + (uVar6 - 1)] + iVar4 * 10 + -0x30;
          if ((uint)length == uVar6) goto LAB_0028ef8c;
          bVar2 = uVar6 < (uint)length;
          bVar9 = uVar6 != uVar3;
          uVar6 = uVar6 + 1;
        } while (bVar9);
      }
      *status = U_INVALID_FORMAT_ERROR;
      uVar7 = iVar4 * iVar8;
      if (bVar2) {
        uVar7 = 0;
      }
      return uVar7;
    }
  }
  *status = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

static int32_t parseAsciiDigits(const UnicodeString& str, int32_t start, int32_t length, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (length <= 0 || str.length() < start || (start + length) > str.length()) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t sign = 1;
    if (str.charAt(start) == PLUS) {
        start++;
        length--;
    } else if (str.charAt(start) == MINUS) {
        sign = -1;
        start++;
        length--;
    }
    int32_t num = 0;
    for (int32_t i = 0; i < length; i++) {
        int32_t digit = str.charAt(start + i) - 0x0030;
        if (digit < 0 || digit > 9) {
            status = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        num = 10 * num + digit;
    }
    return sign * num;    
}